

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

void highsLogHeader(HighsLogOptions *log_options,bool log_githash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte in_SIL;
  HighsLogOptions *in_RDI;
  string githash_text;
  string githash_string;
  char *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  allocator local_8a;
  byte local_89;
  string local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string local_68 [55];
  allocator local_31;
  string local_30 [39];
  byte local_9;
  HighsLogOptions *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"fd8665394",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_89 = 0;
  if ((local_9 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_8a);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a);
  }
  else {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    local_89 = 1;
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  highsLogUser(local_8,kInfo,"Running HiGHS %d.%d.%d%s: %s\n",1,10,0,uVar1,uVar2);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void highsLogHeader(const HighsLogOptions& log_options,
                    const bool log_githash) {
  const std::string githash_string(HIGHS_GITHASH);
  const std::string githash_text =
      log_githash ? " (git hash: " + githash_string + ")" : "";
  highsLogUser(log_options, HighsLogType::kInfo,
               "Running HiGHS %d.%d.%d%s: %s\n", (int)HIGHS_VERSION_MAJOR,
               (int)HIGHS_VERSION_MINOR, (int)HIGHS_VERSION_PATCH,
               githash_text.c_str(), kHighsCopyrightStatement.c_str());
}